

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericconstant.cpp
# Opt level: O0

void __thiscall NumericConstant::NumericConstant(NumericConstant *this,int64_t value)

{
  string local_38;
  int64_t local_18;
  int64_t value_local;
  NumericConstant *this_local;
  
  local_18 = value;
  value_local = (int64_t)this;
  std::__cxx11::to_string(&local_38,value);
  NumericConstant(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

NumericConstant::NumericConstant(std::int64_t value)
	: NumericConstant(std::to_string(value)) {

}